

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cpp
# Opt level: O1

id gpt_sample_top_k_top_p_repeat
             (gpt_vocab *vocab,float *logits,int32_t *last_n_tokens_data,
             size_t last_n_tokens_data_size,int top_k,double top_p,double temp,int repeat_last_n,
             float repeat_penalty,mt19937 *rng)

{
  undefined8 uVar1;
  double *pdVar2;
  uint uVar3;
  float fVar4;
  id iVar5;
  int iVar6;
  result_type rVar7;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> _Var8;
  uint uVar9;
  pointer ppVar10;
  ulong uVar11;
  id iVar12;
  pair<double,_int> *kv_1;
  long lVar13;
  pointer ppVar14;
  __normal_iterator<std::pair<double,_int>_*,_std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>_>
  __i;
  pair<double,_int> *ppVar15;
  long lVar16;
  size_type sVar17;
  bool bVar18;
  float fVar19;
  undefined4 uVar20;
  undefined4 uVar21;
  vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_> logits_id;
  vector<double,_std::allocator<double>_> probs;
  discrete_distribution<int> dist;
  vector<int,_std::allocator<int>_> last_n_tokens;
  double local_d0;
  vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_> local_c8;
  vector<double,_std::allocator<double>_> local_a8;
  uint local_8c;
  double local_88;
  param_type local_80;
  void *local_50;
  int *local_48;
  long local_40;
  double local_38;
  
  local_88 = (double)CONCAT44(local_88._4_4_,repeat_penalty);
  uVar1 = *(undefined8 *)&vocab->field_0x58;
  local_38 = top_p;
  std::vector<int,std::allocator<int>>::vector<int_const*,void>
            ((vector<int,std::allocator<int>> *)&local_50,last_n_tokens_data,
             last_n_tokens_data + last_n_tokens_data_size,(allocator_type *)&local_80);
  uVar9 = (uint)uVar1;
  if (temp <= 0.0) {
    iVar12 = 0;
    if (1 < (int)uVar9) {
      fVar19 = *logits;
      iVar12 = 0;
      uVar11 = 1;
      do {
        fVar4 = logits[uVar11];
        iVar5 = (id)uVar11;
        if (logits[uVar11] <= fVar19) {
          fVar4 = fVar19;
          iVar5 = iVar12;
        }
        iVar12 = iVar5;
        fVar19 = fVar4;
        uVar11 = uVar11 + 1;
      } while ((uVar9 & 0x7fffffff) != uVar11);
    }
  }
  else {
    local_c8.super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>.
    _M_impl.super__Vector_impl_data._M_start = (pair<double,_int> *)0x0;
    local_c8.super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pair<double,_int> *)0x0;
    local_c8.super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pair<double,_int> *)0x0;
    std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>::reserve
              (&local_c8,(long)(int)uVar9);
    local_a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)((ulong)local_a8.super__Vector_base<double,_std::allocator<double>_>._M_impl
                                .super__Vector_impl_data._M_start & 0xffffffff00000000);
    local_8c = top_k;
    if (0 < (int)uVar9) {
      do {
        if ((repeat_last_n < 1) ||
           (_Var8 = std::
                    __find_if<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_equals_val<int_const>>
                              (local_48 + -(ulong)(uint)repeat_last_n,local_48,&local_a8),
           _Var8._M_current == local_48)) {
          local_80._M_prob.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start =
               (pointer)(double)(logits[(int)local_a8.
                                             super__Vector_base<double,_std::allocator<double>_>.
                                             _M_impl.super__Vector_impl_data._M_start] *
                                (float)(1.0 / temp));
          local_80._M_prob.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_finish._0_4_ =
               (int)local_a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start;
          if (local_c8.
              super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>.
              _M_impl.super__Vector_impl_data._M_finish !=
              local_c8.
              super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage) goto LAB_00123ea3;
          std::vector<std::pair<double,int>,std::allocator<std::pair<double,int>>>::
          _M_realloc_insert<std::pair<double,int>>
                    ((vector<std::pair<double,int>,std::allocator<std::pair<double,int>>> *)
                     &local_c8,
                     (iterator)
                     local_c8.
                     super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish,(pair<double,_int> *)&local_80);
        }
        else {
          fVar19 = logits[(int)local_a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                               super__Vector_impl_data._M_start] * (float)(1.0 / temp);
          if (logits[(int)local_a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start] < 0.0) {
            local_80._M_prob.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)(double)(fVar19 * local_88._0_4_);
            local_80._M_prob.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_finish._0_4_ =
                 (int)local_a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start;
            if (local_c8.
                super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>
                ._M_impl.super__Vector_impl_data._M_finish !=
                local_c8.
                super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage) goto LAB_00123ea3;
            std::vector<std::pair<double,int>,std::allocator<std::pair<double,int>>>::
            _M_realloc_insert<std::pair<double,int>>
                      ((vector<std::pair<double,int>,std::allocator<std::pair<double,int>>> *)
                       &local_c8,
                       (iterator)
                       local_c8.
                       super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish,(pair<double,_int> *)&local_80);
          }
          else {
            local_80._M_prob.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)(double)(fVar19 / local_88._0_4_);
            local_80._M_prob.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_finish._0_4_ =
                 (int)local_a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start;
            if (local_c8.
                super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>
                ._M_impl.super__Vector_impl_data._M_finish ==
                local_c8.
                super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage) {
              std::vector<std::pair<double,int>,std::allocator<std::pair<double,int>>>::
              _M_realloc_insert<std::pair<double,int>>
                        ((vector<std::pair<double,int>,std::allocator<std::pair<double,int>>> *)
                         &local_c8,
                         (iterator)
                         local_c8.
                         super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish,(pair<double,_int> *)&local_80);
            }
            else {
LAB_00123ea3:
              (local_c8.
               super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>.
               _M_impl.super__Vector_impl_data._M_finish)->first =
                   (double)local_80._M_prob.super__Vector_base<double,_std::allocator<double>_>.
                           _M_impl.super__Vector_impl_data._M_start;
              *(ulong *)&(local_c8.
                          super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish)->second =
                   CONCAT44(local_80._M_prob.super__Vector_base<double,_std::allocator<double>_>.
                            _M_impl.super__Vector_impl_data._M_finish._4_4_,
                            (int)local_80._M_prob.
                                 super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                 super__Vector_impl_data._M_finish);
              local_c8.
              super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>.
              _M_impl.super__Vector_impl_data._M_finish =
                   local_c8.
                   super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish + 1;
            }
          }
        }
        iVar6 = (int)local_a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start + 1;
        local_a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_start = (pointer)CONCAT44(local_a8.super__Vector_base<double,_std::allocator<double>_>.
                                      _M_impl.super__Vector_impl_data._M_start._4_4_,iVar6);
      } while (iVar6 < (int)uVar9);
    }
    ppVar14 = local_c8.
              super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    ppVar10 = local_c8.
              super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>.
              _M_impl.super__Vector_impl_data._M_start;
    sVar17 = (size_type)(int)local_8c;
    lVar13 = sVar17 * 0x10;
    ppVar15 = local_c8.
              super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>.
              _M_impl.super__Vector_impl_data._M_start + sVar17;
    uVar9 = local_8c;
    if (1 < (int)local_8c) {
      lVar16 = (long)((sVar17 - ((long)(sVar17 - 2) >> 0x3f)) + -2) >> 1;
      do {
        std::
        __adjust_heap<__gnu_cxx::__normal_iterator<std::pair<double,int>*,std::vector<std::pair<double,int>,std::allocator<std::pair<double,int>>>>,long,std::pair<double,int>,__gnu_cxx::__ops::_Iter_comp_iter<gpt_sample_top_k_top_p_repeat(gpt_vocab_const&,float_const*,int_const*,unsigned_long,int,double,double,int,float,std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>&)::__0>>
                  (SUB84(ppVar10[lVar16].first,0),ppVar10,lVar16,sVar17,ppVar10[lVar16].second);
        bVar18 = lVar16 != 0;
        lVar16 = lVar16 + -1;
        uVar9 = local_8c;
      } while (bVar18);
    }
    for (; uVar3 = local_8c, ppVar15 < ppVar14; ppVar15 = ppVar15 + 1) {
      local_8c = uVar9;
      if (ppVar10->first < ppVar15->first) {
        iVar6 = ppVar15->second;
        ppVar15->first = ppVar10->first;
        ppVar15->second = ppVar10->second;
        std::
        __adjust_heap<__gnu_cxx::__normal_iterator<std::pair<double,int>*,std::vector<std::pair<double,int>,std::allocator<std::pair<double,int>>>>,long,std::pair<double,int>,__gnu_cxx::__ops::_Iter_comp_iter<gpt_sample_top_k_top_p_repeat(gpt_vocab_const&,float_const*,int_const*,unsigned_long,int,double,double,int,float,std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>&)::__0>>
                  (ppVar10,0,sVar17,iVar6);
      }
      uVar9 = local_8c;
      local_8c = uVar3;
    }
    bVar18 = 1 < (int)local_8c;
    local_8c = uVar9;
    if (bVar18) {
      do {
        lVar16 = lVar13 + -0x10;
        uVar1 = *(undefined8 *)((long)&ppVar10[-1].first + lVar13);
        uVar20 = *(undefined4 *)((long)&ppVar10[-1].second + lVar13);
        *(double *)((long)&ppVar10[-1].first + lVar13) = ppVar10->first;
        *(int *)((long)&ppVar10[-1].second + lVar13) = ppVar10->second;
        std::
        __adjust_heap<__gnu_cxx::__normal_iterator<std::pair<double,int>*,std::vector<std::pair<double,int>,std::allocator<std::pair<double,int>>>>,long,std::pair<double,int>,__gnu_cxx::__ops::_Iter_comp_iter<gpt_sample_top_k_top_p_repeat(gpt_vocab_const&,float_const*,int_const*,unsigned_long,int,double,double,int,float,std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>&)::__0>>
                  ((int)uVar1,ppVar10,0,lVar16 >> 4,uVar20);
        lVar13 = lVar16;
      } while (0x10 < lVar16);
    }
    std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>::resize
              (&local_c8,sVar17);
    if (local_c8.
        super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>._M_impl
        .super__Vector_impl_data._M_start ==
        local_c8.
        super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>._M_impl
        .super__Vector_impl_data._M_finish) {
      local_88 = -INFINITY;
    }
    else {
      uVar20 = 0;
      uVar21 = 0xfff00000;
      ppVar10 = local_c8.
                super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      do {
        local_88 = ppVar10->first;
        if (local_88 <= (double)CONCAT44(uVar21,uVar20)) {
          local_88 = (double)CONCAT44(uVar21,uVar20);
        }
        ppVar10 = ppVar10 + 1;
        uVar20 = SUB84(local_88,0);
        uVar21 = (undefined4)((ulong)local_88 >> 0x20);
      } while (ppVar10 !=
               local_c8.
               super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>.
               _M_impl.super__Vector_impl_data._M_finish);
    }
    local_a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start = (double *)0x0;
    local_a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_finish = (double *)0x0;
    local_a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (double *)0x0;
    std::vector<double,_std::allocator<double>_>::reserve
              (&local_a8,
               (long)local_c8.
                     super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)local_c8.
                     super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 4);
    ppVar10 = local_c8.
              super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    if (local_c8.
        super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>._M_impl
        .super__Vector_impl_data._M_start ==
        local_c8.
        super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>._M_impl
        .super__Vector_impl_data._M_finish) {
      local_d0 = 0.0;
      pdVar2 = local_a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
    }
    else {
      local_d0 = 0.0;
      ppVar14 = local_c8.
                super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      do {
        local_80._M_prob.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)exp(ppVar14->first - local_88);
        if (local_a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_finish ==
            local_a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                    ((vector<double,std::allocator<double>> *)&local_a8,
                     (iterator)
                     local_a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_finish,(double *)&local_80);
        }
        else {
          *local_a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish =
               (double)local_80._M_prob.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start;
          local_a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_finish =
               local_a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_finish + 1;
        }
        local_d0 = local_d0 +
                   (double)local_80._M_prob.super__Vector_base<double,_std::allocator<double>_>.
                           _M_impl.super__Vector_impl_data._M_start;
        ppVar14 = ppVar14 + 1;
        pdVar2 = local_a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
      } while (ppVar14 != ppVar10);
    }
    for (; pdVar2 != local_a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_finish; pdVar2 = pdVar2 + 1) {
      *pdVar2 = *pdVar2 / local_d0;
    }
    if (local_38 < 1.0) {
      if ((int)uVar3 < 1) {
        local_d0 = 0.0;
      }
      else {
        local_d0 = 0.0;
        sVar17 = 1;
        do {
          local_d0 = local_d0 +
                     local_a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start[sVar17 - 1];
          if (local_38 <= local_d0) {
            std::vector<double,_std::allocator<double>_>::resize(&local_a8,sVar17);
            std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>::resize
                      (&local_c8,sVar17);
            break;
          }
          bVar18 = sVar17 != uVar3;
          sVar17 = sVar17 + 1;
        } while (bVar18);
      }
      uVar9 = (uint)((ulong)((long)local_a8.super__Vector_base<double,_std::allocator<double>_>.
                                   _M_impl.super__Vector_impl_data._M_finish -
                            (long)local_a8.super__Vector_base<double,_std::allocator<double>_>.
                                  _M_impl.super__Vector_impl_data._M_start) >> 3);
      if (0 < (int)uVar9) {
        uVar11 = 0;
        do {
          local_a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start[uVar11] =
               local_a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start[uVar11] * (1.0 / local_d0);
          uVar11 = uVar11 + 1;
        } while ((uVar9 & 0x7fffffff) != uVar11);
      }
    }
    std::discrete_distribution<int>::param_type::
    param_type<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>>
              (&local_80,
               (__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>)
               local_a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start,
               (__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>)
               local_a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_finish);
    rVar7 = std::discrete_distribution<int>::operator()
                      ((discrete_distribution<int> *)&local_80,rng,&local_80);
    iVar12 = local_c8.
             super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>.
             _M_impl.super__Vector_impl_data._M_start[rVar7].second;
    if (local_80._M_cp.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_80._M_cp.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_80._M_cp.super__Vector_base<double,_std::allocator<double>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_80._M_cp.super__Vector_base<double,_std::allocator<double>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    if (local_80._M_prob.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_80._M_prob.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_80._M_prob.super__Vector_base<double,_std::allocator<double>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_80._M_prob.super__Vector_base<double,_std::allocator<double>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    if (local_a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_start != (double *)0x0) {
      operator_delete(local_a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if (local_c8.
        super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>._M_impl
        .super__Vector_impl_data._M_start != (pair<double,_int> *)0x0) {
      operator_delete(local_c8.
                      super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_c8.
                            super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_c8.
                            super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
  }
  if (local_50 != (void *)0x0) {
    operator_delete(local_50,local_40 - (long)local_50);
  }
  return iVar12;
}

Assistant:

gpt_vocab::id gpt_sample_top_k_top_p_repeat(
        const gpt_vocab & vocab,
        const float * logits,
        const int32_t * last_n_tokens_data,
        size_t last_n_tokens_data_size,
        int    top_k,
        double top_p,
        double temp,
        int repeat_last_n,
        float repeat_penalty,
        std::mt19937 & rng) {

    int n_logits = vocab.id_to_token.size();

    const auto * plogits = logits;

    const auto last_n_tokens = std::vector<int32_t>(last_n_tokens_data, last_n_tokens_data + last_n_tokens_data_size);

    if (temp <= 0) {
        // select the token with the highest logit directly
        float max_logit = plogits[0];
        gpt_vocab::id max_id = 0;

        for (int i = 1; i < n_logits; ++i) {
            if (plogits[i] > max_logit) {
                max_logit = plogits[i];
                max_id = i;
            }
        }
        return max_id;
    }


    std::vector<std::pair<double, gpt_vocab::id>> logits_id;
    logits_id.reserve(n_logits);

    {
        const float scale = 1.0f/temp;
        for (int i = 0; i < n_logits; ++i) {
            // repetition penalty from ctrl paper (https://arxiv.org/abs/1909.05858)
            // credit https://github.com/facebookresearch/llama/compare/main...shawwn:llama:main
            if (repeat_last_n > 0 && std::find(last_n_tokens.end()-repeat_last_n, last_n_tokens.end(), i) != last_n_tokens.end()) {
                // if score < 0 then repetition penalty has to multiplied to reduce the previous token probability
                if (plogits[i] < 0.0f) {
                    logits_id.push_back(std::make_pair(plogits[i]*scale*repeat_penalty, i));
                } else {
                    logits_id.push_back(std::make_pair(plogits[i]*scale/repeat_penalty, i));
                }
            } else {
                logits_id.push_back(std::make_pair(plogits[i]*scale, i));
            }
        }
    }

    // find the top K tokens
    std::partial_sort(
            logits_id.begin(),
            logits_id.begin() + top_k, logits_id.end(),
            [](const std::pair<double, gpt_vocab::id> & a, const std::pair<double, gpt_vocab::id> & b) {
        return a.first > b.first;
    });

    logits_id.resize(top_k);

    double maxl = -INFINITY;
    for (const auto & kv : logits_id) {
        maxl = std::max(maxl, kv.first);
    }

    // compute probs for the top K tokens
    std::vector<double> probs;
    probs.reserve(logits_id.size());

    double sum = 0.0;
    for (const auto & kv : logits_id) {
        double p = exp(kv.first - maxl);
        probs.push_back(p);
        sum += p;
    }

    // normalize the probs
    for (auto & p : probs) {
        p /= sum;
    }

    if (top_p < 1.0f) {
        double cumsum = 0.0f;
        for (int i = 0; i < top_k; i++) {
            cumsum += probs[i];
            if (cumsum >= top_p) {
                top_k = i + 1;
                probs.resize(top_k);
                logits_id.resize(top_k);
                break;
            }
        }

        cumsum = 1.0/cumsum;
        for (int i = 0; i < (int) probs.size(); i++) {
            probs[i] *= cumsum;
        }
    }

//    printf("\n");
//    for (int i = 0; i < (int) probs.size(); i++) {
//    for (int i = 0; i < 10; i++) {
//        printf("%d: '%s' %f\n", i, vocab.id_to_token.at(logits_id[i].second).c_str(), probs[i]);
//    }

    std::discrete_distribution<> dist(probs.begin(), probs.end());
    int idx = dist(rng);

    return logits_id[idx].second;

}